

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kops.c
# Opt level: O3

void m68k_op_move_16_tos_aw(void)

{
  uint uVar1;
  uint uVar2;
  
  if (m68ki_cpu.s_flag != 0) {
    uVar1 = OPER_AW_16();
    m68ki_set_sr(uVar1);
    return;
  }
  uVar2 = m68ki_cpu.t0_flag | m68ki_cpu.t1_flag;
  m68ki_cpu.t1_flag = 0;
  m68ki_cpu.t0_flag = 0;
  m68ki_cpu.sp[0] = m68ki_cpu.dar[0xf];
  m68ki_cpu.s_flag = 4;
  m68ki_cpu.dar[0xf] = m68ki_cpu.sp[(ulong)(m68ki_cpu.m_flag & 2) + 4];
  m68ki_stack_frame_0000
            (m68ki_cpu.ppc,
             m68ki_cpu.n_flag >> 4 & 8 | m68ki_cpu.x_flag >> 4 & 0x10 |
             (uint)(m68ki_cpu.not_z_flag == 0) << 2 | m68ki_cpu.v_flag >> 6 & 2 |
             m68ki_cpu.c_flag >> 8 & 1 | m68ki_cpu.m_flag << 0xb | uVar2 | m68ki_cpu.int_mask,8);
  uVar1 = m68ki_cpu.vbr + 0x20;
  m68ki_cpu.pc = uVar1;
  my_fc_handler(m68ki_cpu.s_flag | 1);
  if (m68ki_cpu.pmmu_enabled != 0) {
    uVar1 = pmmu_translate_addr(uVar1);
  }
  m68ki_cpu.pc = m68k_read_memory_32(uVar1 & m68ki_cpu.address_mask);
  m68ki_remaining_cycles =
       m68ki_remaining_cycles +
       ((uint)m68ki_cpu.cyc_instruction[m68ki_cpu.ir] - (uint)m68ki_cpu.cyc_exception[8]);
  return;
}

Assistant:

static void m68k_op_move_16_tos_aw(void)
{
	if(FLAG_S)
	{
		uint new_sr = OPER_AW_16();
		m68ki_trace_t0();			   /* auto-disable (see m68kcpu.h) */
		m68ki_set_sr(new_sr);
		return;
	}
	m68ki_exception_privilege_violation();
}